

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

int Abc_TtIntersectOne(word *pOut,int fComp,word *pIn,int fComp0,int nWords)

{
  int local_34;
  int w;
  int nWords_local;
  int fComp0_local;
  word *pIn_local;
  int fComp_local;
  word *pOut_local;
  
  if (fComp0 == 0) {
    if (fComp == 0) {
      for (local_34 = 0; local_34 < nWords; local_34 = local_34 + 1) {
        if ((pIn[local_34] & pOut[local_34]) != 0) {
          return 1;
        }
      }
    }
    else {
      for (local_34 = 0; local_34 < nWords; local_34 = local_34 + 1) {
        if ((pIn[local_34] & (pOut[local_34] ^ 0xffffffffffffffff)) != 0) {
          return 1;
        }
      }
    }
  }
  else if (fComp == 0) {
    for (local_34 = 0; local_34 < nWords; local_34 = local_34 + 1) {
      if (((pIn[local_34] ^ 0xffffffffffffffff) & pOut[local_34]) != 0) {
        return 1;
      }
    }
  }
  else {
    for (local_34 = 0; local_34 < nWords; local_34 = local_34 + 1) {
      if (((pIn[local_34] ^ 0xffffffffffffffff) & (pOut[local_34] ^ 0xffffffffffffffff)) != 0) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

static inline int Abc_TtIntersectOne( word * pOut, int fComp, word * pIn, int fComp0, int nWords )
{
    int w;
    if ( fComp0 )
    {
        if ( fComp )
        {
            for ( w = 0; w < nWords; w++ )
                if ( ~pIn[w] & ~pOut[w] )
                    return 1;
        }
        else
        {
            for ( w = 0; w < nWords; w++ )
                if ( ~pIn[w] & pOut[w] )
                    return 1;
        }
    }
    else
    {
        if ( fComp )
        {
            for ( w = 0; w < nWords; w++ )
                if ( pIn[w] & ~pOut[w] )
                    return 1;
        }
        else
        {
            for ( w = 0; w < nWords; w++ )
                if ( pIn[w] & pOut[w] )
                    return 1;
        }
    }
    return 0;
}